

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_312859::Handlers::initHandlers(Handlers *this)

{
  JSONHandler *this_00;
  __shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar1;
  size_type sVar2;
  logic_error *this_02;
  anon_class_1_0_00000001 local_32e9;
  anon_class_8_1_8991fb9c local_32e8;
  bare_handler_t local_32e0;
  allocator<char> local_32b9;
  string local_32b8;
  anon_class_8_1_8991fb9c local_3298;
  bare_handler_t local_3290;
  allocator<char> local_3269;
  string local_3268;
  anon_class_8_1_8991fb9c local_3248;
  bare_handler_t local_3240;
  allocator<char> local_3219;
  string local_3218;
  anon_class_8_1_8991fb9c local_31f8;
  param_handler_t local_31f0;
  allocator<char> local_31c9;
  string local_31c8;
  anon_class_8_1_8991fb9c local_31a8;
  bare_handler_t local_31a0;
  allocator<char> local_3179;
  string local_3178;
  anon_class_8_1_8991fb9c local_3158;
  param_handler_t local_3150;
  allocator<char> local_3129;
  string local_3128;
  anon_class_8_1_8991fb9c local_3108;
  param_handler_t local_3100;
  allocator<char> local_30d9;
  string local_30d8;
  anon_class_8_1_8991fb9c local_30b8;
  param_handler_t local_30b0;
  allocator<char> local_3089;
  string local_3088;
  allocator<char> local_3061;
  string local_3060;
  allocator<char> local_3039;
  string local_3038;
  code *local_3018;
  undefined8 local_3010;
  bare_handler_t local_3008;
  code *local_2fe8;
  undefined8 local_2fe0;
  json_handler_t local_2fd8;
  code *local_2fb8;
  undefined8 local_2fb0;
  bare_handler_t local_2fa8;
  code *local_2f88;
  undefined8 local_2f80;
  json_handler_t local_2f78;
  allocator<char> local_2f51;
  string local_2f50;
  anon_class_8_1_8991fb9c local_2f30;
  param_handler_t local_2f28;
  allocator<char> local_2f01;
  string local_2f00;
  anon_class_8_1_8991fb9c local_2ee0;
  param_handler_t local_2ed8;
  allocator<char> local_2eb1;
  string local_2eb0;
  anon_class_8_1_8991fb9c local_2e90;
  param_handler_t local_2e88;
  allocator<char> local_2e61;
  string local_2e60;
  allocator<char> local_2e39;
  string local_2e38;
  allocator<char> local_2e11;
  string local_2e10;
  code *local_2df0;
  undefined8 local_2de8;
  bare_handler_t local_2de0;
  code *local_2dc0;
  undefined8 local_2db8;
  json_handler_t local_2db0;
  code *local_2d90;
  undefined8 local_2d88;
  bare_handler_t local_2d80;
  code *local_2d60;
  undefined8 local_2d58;
  json_handler_t local_2d50;
  allocator<char> local_2d29;
  string local_2d28;
  code *local_2d08;
  undefined8 local_2d00;
  bare_handler_t local_2cf8;
  code *local_2cd8;
  undefined8 local_2cd0;
  json_handler_t local_2cc8;
  allocator<char> local_2ca1;
  string local_2ca0;
  anon_class_8_1_8991fb9c local_2c80;
  param_handler_t local_2c78;
  code *local_2c58;
  undefined8 local_2c50;
  bare_handler_t local_2c48;
  code *local_2c28;
  undefined8 local_2c20;
  json_handler_t local_2c18;
  allocator<char> local_2bf1;
  string local_2bf0;
  anon_class_8_1_8991fb9c local_2bd0;
  bare_handler_t local_2bc8;
  allocator<char> local_2ba1;
  string local_2ba0;
  anon_class_8_1_8991fb9c local_2b80;
  bare_handler_t local_2b78;
  allocator<char> local_2b51;
  string local_2b50;
  anon_class_8_1_8991fb9c local_2b30;
  bare_handler_t local_2b28;
  allocator<char> local_2b01;
  string local_2b00;
  anon_class_8_1_8991fb9c local_2ae0;
  bare_handler_t local_2ad8;
  allocator<char> local_2ab1;
  string local_2ab0;
  anon_class_8_1_8991fb9c local_2a90;
  bare_handler_t local_2a88;
  allocator<char> local_2a61;
  string local_2a60;
  anon_class_8_1_8991fb9c local_2a40;
  param_handler_t local_2a38;
  allocator<char> local_2a11;
  string local_2a10;
  allocator<char> local_29e9;
  string local_29e8;
  allocator<char> local_29c1;
  string local_29c0;
  code *local_29a0;
  undefined8 local_2998;
  bare_handler_t local_2990;
  code *local_2970;
  undefined8 local_2968;
  json_handler_t local_2960;
  code *local_2940;
  undefined8 local_2938;
  bare_handler_t local_2930;
  code *local_2910;
  undefined8 local_2908;
  json_handler_t local_2900;
  allocator<char> local_28d9;
  string local_28d8;
  anon_class_8_1_8991fb9c local_28b8;
  bare_handler_t local_28b0;
  allocator<char> local_2889;
  string local_2888;
  anon_class_8_1_8991fb9c local_2868;
  param_handler_t local_2860;
  allocator<char> local_2839;
  string local_2838;
  anon_class_8_1_8991fb9c local_2818;
  param_handler_t local_2810;
  allocator<char> local_27e9;
  string local_27e8;
  anon_class_8_1_8991fb9c local_27c8;
  param_handler_t local_27c0;
  allocator<char> local_2799;
  string local_2798;
  anon_class_8_1_8991fb9c local_2778;
  bare_handler_t local_2770;
  allocator<char> local_2749;
  string local_2748;
  anon_class_8_1_8991fb9c local_2728;
  bare_handler_t local_2720;
  allocator<char> local_26f9;
  string local_26f8;
  anon_class_8_1_8991fb9c local_26d8;
  bare_handler_t local_26d0;
  allocator<char> local_26a9;
  string local_26a8;
  anon_class_8_1_8991fb9c local_2688;
  param_handler_t local_2680;
  allocator<char> local_2659;
  string local_2658;
  anon_class_8_1_8991fb9c local_2638;
  param_handler_t local_2630;
  allocator<char> local_2609;
  string local_2608;
  anon_class_8_1_8991fb9c local_25e8;
  param_handler_t local_25e0;
  allocator<char> local_25b9;
  string local_25b8;
  allocator<char> local_2591;
  string local_2590;
  allocator<char> local_2569;
  string local_2568;
  code *local_2548;
  undefined8 local_2540;
  bare_handler_t local_2538;
  code *local_2518;
  undefined8 local_2510;
  json_handler_t local_2508;
  code *local_24e8;
  undefined8 local_24e0;
  bare_handler_t local_24d8;
  code *local_24b8;
  undefined8 local_24b0;
  json_handler_t local_24a8;
  allocator<char> local_2481;
  string local_2480;
  anon_class_8_1_8991fb9c local_2460;
  param_handler_t local_2458;
  code *local_2438;
  undefined8 local_2430;
  bare_handler_t local_2428;
  code *local_2408;
  undefined8 local_2400;
  json_handler_t local_23f8;
  allocator<char> local_23d1;
  string local_23d0;
  anon_class_8_1_8991fb9c local_23b0;
  bare_handler_t local_23a8;
  allocator<char> local_2381;
  string local_2380;
  anon_class_8_1_8991fb9c local_2360;
  param_handler_t local_2358;
  allocator<char> local_2331;
  string local_2330;
  anon_class_8_1_8991fb9c local_2310;
  param_handler_t local_2308;
  allocator<char> local_22e1;
  string local_22e0;
  anon_class_8_1_8991fb9c local_22c0;
  param_handler_t local_22b8;
  allocator<char> local_2291;
  string local_2290;
  anon_class_8_1_8991fb9c local_2270;
  param_handler_t local_2268;
  allocator<char> local_2241;
  string local_2240;
  anon_class_8_1_8991fb9c local_2220;
  param_handler_t local_2218;
  allocator<char> local_21f1;
  string local_21f0;
  anon_class_8_1_8991fb9c local_21d0;
  param_handler_t local_21c8;
  allocator<char> local_21a1;
  string local_21a0;
  allocator<char> local_2179;
  string local_2178;
  code *local_2158;
  undefined8 local_2150;
  bare_handler_t local_2148;
  code *local_2128;
  undefined8 local_2120;
  json_handler_t local_2118;
  code *local_20f8;
  undefined8 local_20f0;
  bare_handler_t local_20e8;
  code *local_20c8;
  undefined8 local_20c0;
  json_handler_t local_20b8;
  allocator<char> local_2091;
  string local_2090;
  anon_class_8_1_8991fb9c local_2070;
  param_handler_t local_2068;
  allocator<char> local_2041;
  string local_2040;
  anon_class_8_1_8991fb9c local_2020;
  param_handler_t local_2018;
  allocator<char> local_1ff1;
  string local_1ff0;
  anon_class_8_1_8991fb9c local_1fd0;
  bare_handler_t local_1fc8;
  allocator<char> local_1fa1;
  string local_1fa0;
  anon_class_8_1_8991fb9c local_1f80;
  param_handler_t local_1f78;
  allocator<char> local_1f51;
  string local_1f50;
  anon_class_8_1_8991fb9c local_1f30;
  param_handler_t local_1f28;
  allocator<char> local_1f01;
  string local_1f00;
  anon_class_8_1_8991fb9c local_1ee0;
  bare_handler_t local_1ed8;
  allocator<char> local_1eb1;
  string local_1eb0;
  anon_class_8_1_8991fb9c local_1e90;
  bare_handler_t local_1e88;
  allocator<char> local_1e61;
  string local_1e60;
  anon_class_8_1_8991fb9c local_1e40;
  bare_handler_t local_1e38;
  allocator<char> local_1e11;
  string local_1e10;
  anon_class_8_1_8991fb9c local_1df0;
  param_handler_t local_1de8;
  allocator<char> local_1dc1;
  string local_1dc0;
  anon_class_8_1_8991fb9c local_1da0;
  bare_handler_t local_1d98;
  allocator<char> local_1d71;
  string local_1d70;
  anon_class_8_1_8991fb9c local_1d50;
  bare_handler_t local_1d48;
  allocator<char> local_1d21;
  string local_1d20;
  anon_class_8_1_8991fb9c local_1d00;
  bare_handler_t local_1cf8;
  allocator<char> local_1cd1;
  string local_1cd0;
  anon_class_8_1_8991fb9c local_1cb0;
  bare_handler_t local_1ca8;
  allocator<char> local_1c81;
  string local_1c80;
  anon_class_8_1_8991fb9c local_1c60;
  bare_handler_t local_1c58;
  allocator<char> local_1c31;
  string local_1c30;
  anon_class_8_1_8991fb9c local_1c10;
  param_handler_t local_1c08;
  allocator<char> local_1be1;
  string local_1be0;
  anon_class_8_1_8991fb9c local_1bc0;
  param_handler_t local_1bb8;
  allocator<char> local_1b91;
  string local_1b90;
  anon_class_8_1_8991fb9c local_1b70;
  bare_handler_t local_1b68;
  allocator<char> local_1b41;
  string local_1b40;
  anon_class_8_1_8991fb9c local_1b20;
  param_handler_t local_1b18;
  allocator<char> local_1af1;
  string local_1af0;
  anon_class_8_1_8991fb9c local_1ad0;
  param_handler_t local_1ac8;
  allocator<char> local_1aa1;
  string local_1aa0;
  anon_class_8_1_8991fb9c local_1a80;
  param_handler_t local_1a78;
  allocator<char> local_1a51;
  string local_1a50;
  anon_class_8_1_8991fb9c local_1a30;
  param_handler_t local_1a28;
  code *local_1a08;
  undefined8 local_1a00;
  bare_handler_t local_19f8;
  code *local_19d8;
  undefined8 local_19d0;
  json_handler_t local_19c8;
  allocator<char> local_19a1;
  string local_19a0;
  anon_class_8_1_8991fb9c local_1980;
  param_handler_t local_1978;
  code *local_1958;
  undefined8 local_1950;
  bare_handler_t local_1948;
  code *local_1928;
  undefined8 local_1920;
  json_handler_t local_1918;
  allocator<char> local_18f1;
  string local_18f0;
  anon_class_8_1_8991fb9c local_18d0;
  param_handler_t local_18c8;
  allocator<char> local_18a1;
  string local_18a0;
  anon_class_8_1_8991fb9c local_1880;
  param_handler_t local_1878;
  allocator<char> local_1851;
  string local_1850;
  anon_class_8_1_8991fb9c local_1830;
  bare_handler_t local_1828;
  allocator<char> local_1801;
  string local_1800;
  anon_class_8_1_8991fb9c local_17e0;
  bare_handler_t local_17d8;
  allocator<char> local_17b1;
  string local_17b0;
  anon_class_8_1_8991fb9c local_1790;
  bare_handler_t local_1788;
  allocator<char> local_1761;
  string local_1760;
  anon_class_8_1_8991fb9c local_1740;
  bare_handler_t local_1738;
  allocator<char> local_1711;
  string local_1710;
  anon_class_8_1_8991fb9c local_16f0;
  param_handler_t local_16e8;
  allocator<char> local_16c1;
  string local_16c0;
  anon_class_8_1_8991fb9c local_16a0;
  bare_handler_t local_1698;
  allocator<char> local_1671;
  string local_1670;
  anon_class_8_1_8991fb9c local_1650;
  bare_handler_t local_1648;
  allocator<char> local_1621;
  string local_1620;
  anon_class_8_1_8991fb9c local_1600;
  bare_handler_t local_15f8;
  allocator<char> local_15d1;
  string local_15d0;
  anon_class_8_1_8991fb9c local_15b0;
  bare_handler_t local_15a8;
  allocator<char> local_1581;
  string local_1580;
  anon_class_8_1_8991fb9c local_1560;
  bare_handler_t local_1558;
  allocator<char> local_1531;
  string local_1530;
  anon_class_8_1_8991fb9c local_1510;
  bare_handler_t local_1508;
  allocator<char> local_14e1;
  string local_14e0;
  anon_class_8_1_8991fb9c local_14c0;
  bare_handler_t local_14b8;
  allocator<char> local_1491;
  string local_1490;
  anon_class_8_1_8991fb9c local_1470;
  bare_handler_t local_1468;
  allocator<char> local_1441;
  string local_1440;
  anon_class_8_1_8991fb9c local_1420;
  bare_handler_t local_1418;
  allocator<char> local_13f1;
  string local_13f0;
  anon_class_8_1_8991fb9c local_13d0;
  bare_handler_t local_13c8;
  allocator<char> local_13a1;
  string local_13a0;
  anon_class_8_1_8991fb9c local_1380;
  param_handler_t local_1378;
  allocator<char> local_1351;
  string local_1350;
  anon_class_8_1_8991fb9c local_1330;
  param_handler_t local_1328;
  allocator<char> local_1301;
  string local_1300;
  anon_class_8_1_8991fb9c local_12e0;
  param_handler_t local_12d8;
  allocator<char> local_12b1;
  string local_12b0;
  anon_class_8_1_8991fb9c local_1290;
  param_handler_t local_1288;
  allocator<char> local_1261;
  string local_1260;
  anon_class_8_1_8991fb9c local_1240;
  param_handler_t local_1238;
  allocator<char> local_1211;
  string local_1210;
  anon_class_8_1_8991fb9c local_11f0;
  bare_handler_t local_11e8;
  allocator<char> local_11c1;
  string local_11c0;
  anon_class_8_1_8991fb9c local_11a0;
  param_handler_t local_1198;
  allocator<char> local_1171;
  string local_1170;
  anon_class_8_1_8991fb9c local_1150;
  param_handler_t local_1148;
  allocator<char> local_1121;
  string local_1120;
  anon_class_8_1_8991fb9c local_1100;
  param_handler_t local_10f8;
  allocator<char> local_10d1;
  string local_10d0;
  code *local_10b0;
  undefined8 local_10a8;
  bare_handler_t local_10a0;
  code *local_1080;
  undefined8 local_1078;
  json_handler_t local_1070;
  allocator<char> local_1049;
  string local_1048;
  anon_class_8_1_8991fb9c local_1028;
  param_handler_t local_1020;
  allocator<char> local_ff9;
  string local_ff8;
  anon_class_8_1_8991fb9c local_fd8;
  bare_handler_t local_fd0;
  allocator<char> local_fa9;
  string local_fa8;
  anon_class_8_1_8991fb9c local_f88;
  param_handler_t local_f80;
  allocator<char> local_f59;
  string local_f58;
  anon_class_8_1_8991fb9c local_f38;
  param_handler_t local_f30;
  allocator<char> local_f09;
  string local_f08;
  anon_class_8_1_8991fb9c local_ee8;
  param_handler_t local_ee0;
  allocator<char> local_eb9;
  string local_eb8;
  anon_class_8_1_8991fb9c local_e98;
  param_handler_t local_e90;
  allocator<char> local_e69;
  string local_e68;
  anon_class_8_1_8991fb9c local_e48;
  param_handler_t local_e40;
  allocator<char> local_e19;
  string local_e18;
  anon_class_8_1_8991fb9c local_df8;
  bare_handler_t local_df0;
  allocator<char> local_dc9;
  string local_dc8;
  anon_class_8_1_8991fb9c local_da8;
  param_handler_t local_da0;
  allocator<char> local_d79;
  string local_d78;
  anon_class_8_1_8991fb9c local_d58;
  param_handler_t local_d50;
  allocator<char> local_d29;
  string local_d28;
  anon_class_8_1_8991fb9c local_d08;
  param_handler_t local_d00;
  allocator<char> local_cd9;
  string local_cd8;
  code *local_cb8;
  undefined8 local_cb0;
  bare_handler_t local_ca8;
  code *local_c88;
  undefined8 local_c80;
  json_handler_t local_c78;
  allocator<char> local_c51;
  string local_c50;
  anon_class_8_1_8991fb9c local_c30;
  param_handler_t local_c28;
  allocator<char> local_c01;
  string local_c00;
  anon_class_8_1_8991fb9c local_be0;
  param_handler_t local_bd8;
  allocator<char> local_bb1;
  string local_bb0;
  anon_class_8_1_8991fb9c local_b90;
  param_handler_t local_b88;
  allocator<char> local_b61;
  string local_b60;
  anon_class_8_1_8991fb9c local_b40;
  param_handler_t local_b38;
  allocator<char> local_b11;
  string local_b10;
  code *local_af0;
  undefined8 local_ae8;
  bare_handler_t local_ae0;
  code *local_ac0;
  undefined8 local_ab8;
  json_handler_t local_ab0;
  allocator<char> local_a89;
  string local_a88;
  allocator<char> local_a61;
  string local_a60;
  allocator<char> local_a39;
  string local_a38;
  allocator<char> local_a11;
  string local_a10;
  code *local_9f0;
  undefined8 local_9e8;
  bare_handler_t local_9e0;
  code *local_9c0;
  undefined8 local_9b8;
  json_handler_t local_9b0;
  allocator<char> local_989;
  string local_988;
  anon_class_8_1_8991fb9c local_968;
  bare_handler_t local_960;
  allocator<char> local_939;
  string local_938;
  anon_class_8_1_8991fb9c local_918;
  param_handler_t local_910;
  allocator<char> local_8e9;
  string local_8e8;
  anon_class_8_1_8991fb9c local_8c8;
  param_handler_t local_8c0;
  allocator<char> local_899;
  string local_898;
  anon_class_8_1_8991fb9c local_878;
  bare_handler_t local_870;
  allocator<char> local_849;
  string local_848;
  anon_class_8_1_8991fb9c local_828;
  param_handler_t local_820;
  allocator<char> local_7f9;
  string local_7f8;
  anon_class_8_1_8991fb9c local_7d8;
  param_handler_t local_7d0;
  allocator<char> local_7a9;
  string local_7a8;
  anon_class_8_1_8991fb9c local_788;
  param_handler_t local_780;
  allocator<char> local_759;
  string local_758;
  anon_class_8_1_8991fb9c local_738;
  param_handler_t local_730;
  allocator<char> local_709;
  string local_708;
  anon_class_8_1_8991fb9c local_6e8;
  bare_handler_t local_6e0;
  allocator<char> local_6b9;
  string local_6b8;
  anon_class_8_1_8991fb9c local_698;
  param_handler_t local_690;
  allocator<char> local_669;
  string local_668;
  anon_class_8_1_8991fb9c local_648;
  param_handler_t local_640;
  allocator<char> local_619;
  string local_618;
  anon_class_8_1_8991fb9c local_5f8;
  bare_handler_t local_5f0;
  allocator<char> local_5c9;
  string local_5c8;
  anon_class_8_1_8991fb9c local_5a8;
  bare_handler_t local_5a0;
  allocator<char> local_579;
  string local_578;
  anon_class_8_1_8991fb9c local_558;
  bare_handler_t local_550;
  allocator<char> local_529;
  string local_528;
  anon_class_8_1_8991fb9c local_508;
  bare_handler_t local_500;
  allocator<char> local_4d9;
  string local_4d8;
  anon_class_8_1_8991fb9c local_4b8;
  bare_handler_t local_4b0;
  allocator<char> local_489;
  string local_488;
  anon_class_8_1_8991fb9c local_468;
  param_handler_t local_460;
  allocator<char> local_439;
  string local_438;
  anon_class_8_1_8991fb9c local_418;
  bare_handler_t local_410;
  allocator<char> local_3e9;
  string local_3e8;
  anon_class_8_1_8991fb9c local_3c8;
  param_handler_t local_3c0;
  allocator<char> local_399;
  string local_398;
  anon_class_8_1_8991fb9c local_378;
  param_handler_t local_370;
  allocator<char> local_349;
  string local_348;
  anon_class_8_1_8991fb9c local_328;
  param_handler_t local_320;
  allocator<char> local_2f9;
  string local_2f8;
  anon_class_8_1_8991fb9c local_2d8;
  bare_handler_t local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  anon_class_8_1_8991fb9c local_288;
  bare_handler_t local_280;
  allocator<char> local_259;
  string local_258;
  anon_class_8_1_8991fb9c local_238;
  bare_handler_t local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  anon_class_8_1_8991fb9c local_198;
  bare_handler_t local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  anon_class_8_1_8991fb9c local_120;
  param_handler_t local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  anon_class_8_1_8991fb9c local_80;
  void_handler_t local_78;
  anon_class_1_0_00000001 local_51;
  json_handler_t local_50;
  shared_ptr<JSONHandler> local_20;
  Handlers *local_10;
  Handlers *this_local;
  
  local_10 = this;
  std::make_shared<JSONHandler>();
  std::vector<std::shared_ptr<JSONHandler>,std::allocator<std::shared_ptr<JSONHandler>>>::
  emplace_back<std::shared_ptr<JSONHandler>>
            ((vector<std::shared_ptr<JSONHandler>,std::allocator<std::shared_ptr<JSONHandler>>> *)
             this,&local_20);
  std::shared_ptr<JSONHandler>::~shared_ptr(&local_20);
  this_01 = &std::
             vector<std::shared_ptr<JSONHandler>,_std::allocator<std::shared_ptr<JSONHandler>_>_>::
             back(&this->json_handlers)->super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>
  ;
  peVar1 = std::__shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>::get(this_01);
  this->jh = peVar1;
  this_00 = this->jh;
  std::function<void(std::__cxx11::string_const&,JSON)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__0,void>
            ((function<void(std::__cxx11::string_const&,JSON)> *)&local_50,&local_51);
  local_80.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__1,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_78,&local_80);
  JSONHandler::addDictHandlers(this_00,&local_50,&local_78);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_78);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
  ::~function(&local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"inputFile",&local_a1);
  pushKey(this,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  setupInputFile(this);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"password",&local_c9);
  pushKey(this,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  setupPassword(this);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"passwordFile",&local_f1);
  pushKey(this,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  local_120.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__2,void>
            ((function<void(char_const*)> *)&local_118,&local_120);
  addParameter(this,&local_118);
  std::function<void_(const_char_*)>::~function(&local_118);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"empty",&local_141);
  pushKey(this,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  setupEmpty(this);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"jsonInput",&local_169);
  pushKey(this,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  local_198.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__3,void>
            ((function<void()> *)&local_190,&local_198);
  addBare(this,&local_190);
  std::function<void_()>::~function(&local_190);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"outputFile",&local_1b9);
  pushKey(this,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  setupOutputFile(this);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"replaceInput",&local_1e1)
  ;
  pushKey(this,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  setupReplaceInput(this);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"qdf",&local_209);
  pushKey(this,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  local_238.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__4,void>
            ((function<void()> *)&local_230,&local_238);
  addBare(this,&local_230);
  std::function<void_()>::~function(&local_230);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"preserveUnreferenced",&local_259);
  pushKey(this,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  local_288.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__5,void>
            ((function<void()> *)&local_280,&local_288);
  addBare(this,&local_280);
  std::function<void_()>::~function(&local_280);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"newlineBeforeEndstream",&local_2a9);
  pushKey(this,&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  local_2d8.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__6,void>
            ((function<void()> *)&local_2d0,&local_2d8);
  addBare(this,&local_2d0);
  std::function<void_()>::~function(&local_2d0);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f8,"normalizeContent",&local_2f9);
  pushKey(this,&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  local_328.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__7,void>
            ((function<void(char_const*)> *)&local_320,&local_328);
  addChoices(this,initHandlers::yn_choices,true,&local_320);
  std::function<void_(const_char_*)>::~function(&local_320);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"streamData",&local_349);
  pushKey(this,&local_348);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator(&local_349);
  local_378.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__8,void>
            ((function<void(char_const*)> *)&local_370,&local_378);
  addChoices(this,initHandlers::stream_data_choices,true,&local_370);
  std::function<void_(const_char_*)>::~function(&local_370);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_398,"compressStreams",&local_399);
  pushKey(this,&local_398);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator(&local_399);
  local_3c8.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__9,void>
            ((function<void(char_const*)> *)&local_3c0,&local_3c8);
  addChoices(this,initHandlers::yn_choices,true,&local_3c0);
  std::function<void_(const_char_*)>::~function(&local_3c0);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e8,"recompressFlate",&local_3e9);
  pushKey(this,&local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator(&local_3e9);
  local_418.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__10,void>
            ((function<void()> *)&local_410,&local_418);
  addBare(this,&local_410);
  std::function<void_()>::~function(&local_410);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"decodeLevel",&local_439);
  pushKey(this,&local_438);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator(&local_439);
  local_468.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__11,void>
            ((function<void(char_const*)> *)&local_460,&local_468);
  addChoices(this,initHandlers::decode_level_choices,true,&local_460);
  std::function<void_(const_char_*)>::~function(&local_460);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"decrypt",&local_489);
  pushKey(this,&local_488);
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::~allocator(&local_489);
  local_4b8.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__12,void>
            ((function<void()> *)&local_4b0,&local_4b8);
  addBare(this,&local_4b0);
  std::function<void_()>::~function(&local_4b0);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d8,"deterministicId",&local_4d9);
  pushKey(this,&local_4d8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  local_508.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__13,void>
            ((function<void()> *)&local_500,&local_508);
  addBare(this,&local_500);
  std::function<void_()>::~function(&local_500);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,"staticAesIv",&local_529);
  pushKey(this,&local_528);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator(&local_529);
  local_558.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__14,void>
            ((function<void()> *)&local_550,&local_558);
  addBare(this,&local_550);
  std::function<void_()>::~function(&local_550);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_578,"staticId",&local_579);
  pushKey(this,&local_578);
  std::__cxx11::string::~string((string *)&local_578);
  std::allocator<char>::~allocator(&local_579);
  local_5a8.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__15,void>
            ((function<void()> *)&local_5a0,&local_5a8);
  addBare(this,&local_5a0);
  std::function<void_()>::~function(&local_5a0);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c8,"noOriginalObjectIds",&local_5c9);
  pushKey(this,&local_5c8);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::allocator<char>::~allocator(&local_5c9);
  local_5f8.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__16,void>
            ((function<void()> *)&local_5f0,&local_5f8);
  addBare(this,&local_5f0);
  std::function<void_()>::~function(&local_5f0);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_618,"copyEncryption",&local_619);
  pushKey(this,&local_618);
  std::__cxx11::string::~string((string *)&local_618);
  std::allocator<char>::~allocator(&local_619);
  local_648.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__17,void>
            ((function<void(char_const*)> *)&local_640,&local_648);
  addParameter(this,&local_640);
  std::function<void_(const_char_*)>::~function(&local_640);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_668,"encryptionFilePassword",&local_669);
  pushKey(this,&local_668);
  std::__cxx11::string::~string((string *)&local_668);
  std::allocator<char>::~allocator(&local_669);
  local_698.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__18,void>
            ((function<void(char_const*)> *)&local_690,&local_698);
  addParameter(this,&local_690);
  std::function<void_(const_char_*)>::~function(&local_690);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b8,"linearize",&local_6b9);
  pushKey(this,&local_6b8);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::allocator<char>::~allocator(&local_6b9);
  local_6e8.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__19,void>
            ((function<void()> *)&local_6e0,&local_6e8);
  addBare(this,&local_6e0);
  std::function<void_()>::~function(&local_6e0);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_708,"linearizePass1",&local_709);
  pushKey(this,&local_708);
  std::__cxx11::string::~string((string *)&local_708);
  std::allocator<char>::~allocator(&local_709);
  local_738.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__20,void>
            ((function<void(char_const*)> *)&local_730,&local_738);
  addParameter(this,&local_730);
  std::function<void_(const_char_*)>::~function(&local_730);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_758,"objectStreams",&local_759);
  pushKey(this,&local_758);
  std::__cxx11::string::~string((string *)&local_758);
  std::allocator<char>::~allocator(&local_759);
  local_788.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__21,void>
            ((function<void(char_const*)> *)&local_780,&local_788);
  addChoices(this,initHandlers::object_streams_choices,true,&local_780);
  std::function<void_(const_char_*)>::~function(&local_780);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7a8,"minVersion",&local_7a9);
  pushKey(this,&local_7a8);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::allocator<char>::~allocator(&local_7a9);
  local_7d8.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__22,void>
            ((function<void(char_const*)> *)&local_7d0,&local_7d8);
  addParameter(this,&local_7d0);
  std::function<void_(const_char_*)>::~function(&local_7d0);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7f8,"forceVersion",&local_7f9)
  ;
  pushKey(this,&local_7f8);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::allocator<char>::~allocator(&local_7f9);
  local_828.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__23,void>
            ((function<void(char_const*)> *)&local_820,&local_828);
  addParameter(this,&local_820);
  std::function<void_(const_char_*)>::~function(&local_820);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_848,"progress",&local_849);
  pushKey(this,&local_848);
  std::__cxx11::string::~string((string *)&local_848);
  std::allocator<char>::~allocator(&local_849);
  local_878.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__24,void>
            ((function<void()> *)&local_870,&local_878);
  addBare(this,&local_870);
  std::function<void_()>::~function(&local_870);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_898,"splitPages",&local_899);
  pushKey(this,&local_898);
  std::__cxx11::string::~string((string *)&local_898);
  std::allocator<char>::~allocator(&local_899);
  local_8c8.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__25,void>
            ((function<void(char_const*)> *)&local_8c0,&local_8c8);
  addParameter(this,&local_8c0);
  std::function<void_(const_char_*)>::~function(&local_8c0);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8e8,"jsonOutput",&local_8e9);
  pushKey(this,&local_8e8);
  std::__cxx11::string::~string((string *)&local_8e8);
  std::allocator<char>::~allocator(&local_8e9);
  local_918.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__26,void>
            ((function<void(char_const*)> *)&local_910,&local_918);
  addChoices(this,initHandlers::json_output_choices,false,&local_910);
  std::function<void_(const_char_*)>::~function(&local_910);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_938,"removeRestrictions",&local_939);
  pushKey(this,&local_938);
  std::__cxx11::string::~string((string *)&local_938);
  std::allocator<char>::~allocator(&local_939);
  local_968.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__27,void>
            ((function<void()> *)&local_960,&local_968);
  addBare(this,&local_960);
  std::function<void_()>::~function(&local_960);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_988,"encrypt",&local_989);
  pushKey(this,&local_988);
  std::__cxx11::string::~string((string *)&local_988);
  std::allocator<char>::~allocator(&local_989);
  local_9c0 = beginEncrypt;
  local_9b8 = 0;
  bindJSON(&local_9b0,this,0x284b90);
  local_9f0 = endEncrypt;
  local_9e8 = 0;
  bindBare(&local_9e0,this,0x284f40);
  beginDict(this,&local_9b0,&local_9e0);
  std::function<void_()>::~function(&local_9e0);
  std::function<void_(JSON)>::~function(&local_9b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a10,"userPassword",&local_a11)
  ;
  pushKey(this,&local_a10);
  std::__cxx11::string::~string((string *)&local_a10);
  std::allocator<char>::~allocator(&local_a11);
  setupEncryptUserPassword(this);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a38,"ownerPassword",&local_a39);
  pushKey(this,&local_a38);
  std::__cxx11::string::~string((string *)&local_a38);
  std::allocator<char>::~allocator(&local_a39);
  setupEncryptOwnerPassword(this);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a60,"Bits",&local_a61);
  pushKey(this,&local_a60);
  std::__cxx11::string::~string((string *)&local_a60);
  std::allocator<char>::~allocator(&local_a61);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a88,"40bit",&local_a89);
  pushKey(this,&local_a88);
  std::__cxx11::string::~string((string *)&local_a88);
  std::allocator<char>::~allocator(&local_a89);
  local_ac0 = beginEncrypt40bit;
  local_ab8 = 0;
  bindJSON(&local_ab0,this,0x284fe0);
  local_af0 = endEncrypt40bit;
  local_ae8 = 0;
  bindBare(&local_ae0,this,0x284ff0);
  beginDict(this,&local_ab0,&local_ae0);
  std::function<void_()>::~function(&local_ae0);
  std::function<void_(JSON)>::~function(&local_ab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b10,"annotate",&local_b11);
  pushKey(this,&local_b10);
  std::__cxx11::string::~string((string *)&local_b10);
  std::allocator<char>::~allocator(&local_b11);
  local_b40.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__28,void>
            ((function<void(char_const*)> *)&local_b38,&local_b40);
  addChoices(this,initHandlers::yn_choices,true,&local_b38);
  std::function<void_(const_char_*)>::~function(&local_b38);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b60,"extract",&local_b61);
  pushKey(this,&local_b60);
  std::__cxx11::string::~string((string *)&local_b60);
  std::allocator<char>::~allocator(&local_b61);
  local_b90.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__29,void>
            ((function<void(char_const*)> *)&local_b88,&local_b90);
  addChoices(this,initHandlers::yn_choices,true,&local_b88);
  std::function<void_(const_char_*)>::~function(&local_b88);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_bb0,"modify",&local_bb1);
  pushKey(this,&local_bb0);
  std::__cxx11::string::~string((string *)&local_bb0);
  std::allocator<char>::~allocator(&local_bb1);
  local_be0.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__30,void>
            ((function<void(char_const*)> *)&local_bd8,&local_be0);
  addChoices(this,initHandlers::modify128_choices,true,&local_bd8);
  std::function<void_(const_char_*)>::~function(&local_bd8);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c00,"print",&local_c01);
  pushKey(this,&local_c00);
  std::__cxx11::string::~string((string *)&local_c00);
  std::allocator<char>::~allocator(&local_c01);
  local_c30.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__31,void>
            ((function<void(char_const*)> *)&local_c28,&local_c30);
  addChoices(this,initHandlers::print128_choices,true,&local_c28);
  std::function<void_(const_char_*)>::~function(&local_c28);
  popHandler(this);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c50,"128bit",&local_c51);
  pushKey(this,&local_c50);
  std::__cxx11::string::~string((string *)&local_c50);
  std::allocator<char>::~allocator(&local_c51);
  local_c88 = beginEncrypt128bit;
  local_c80 = 0;
  bindJSON(&local_c78,this,0x285240);
  local_cb8 = endEncrypt128bit;
  local_cb0 = 0;
  bindBare(&local_ca8,this,0x285250);
  beginDict(this,&local_c78,&local_ca8);
  std::function<void_()>::~function(&local_ca8);
  std::function<void_(JSON)>::~function(&local_c78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_cd8,"accessibility",&local_cd9);
  pushKey(this,&local_cd8);
  std::__cxx11::string::~string((string *)&local_cd8);
  std::allocator<char>::~allocator(&local_cd9);
  local_d08.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__32,void>
            ((function<void(char_const*)> *)&local_d00,&local_d08);
  addChoices(this,initHandlers::yn_choices,true,&local_d00);
  std::function<void_(const_char_*)>::~function(&local_d00);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d28,"annotate",&local_d29);
  pushKey(this,&local_d28);
  std::__cxx11::string::~string((string *)&local_d28);
  std::allocator<char>::~allocator(&local_d29);
  local_d58.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__33,void>
            ((function<void(char_const*)> *)&local_d50,&local_d58);
  addChoices(this,initHandlers::yn_choices,true,&local_d50);
  std::function<void_(const_char_*)>::~function(&local_d50);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d78,"assemble",&local_d79);
  pushKey(this,&local_d78);
  std::__cxx11::string::~string((string *)&local_d78);
  std::allocator<char>::~allocator(&local_d79);
  local_da8.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__34,void>
            ((function<void(char_const*)> *)&local_da0,&local_da8);
  addChoices(this,initHandlers::yn_choices,true,&local_da0);
  std::function<void_(const_char_*)>::~function(&local_da0);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_dc8,"cleartextMetadata",&local_dc9);
  pushKey(this,&local_dc8);
  std::__cxx11::string::~string((string *)&local_dc8);
  std::allocator<char>::~allocator(&local_dc9);
  local_df8.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__35,void>
            ((function<void()> *)&local_df0,&local_df8);
  addBare(this,&local_df0);
  std::function<void_()>::~function(&local_df0);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e18,"extract",&local_e19);
  pushKey(this,&local_e18);
  std::__cxx11::string::~string((string *)&local_e18);
  std::allocator<char>::~allocator(&local_e19);
  local_e48.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__36,void>
            ((function<void(char_const*)> *)&local_e40,&local_e48);
  addChoices(this,initHandlers::yn_choices,true,&local_e40);
  std::function<void_(const_char_*)>::~function(&local_e40);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e68,"form",&local_e69);
  pushKey(this,&local_e68);
  std::__cxx11::string::~string((string *)&local_e68);
  std::allocator<char>::~allocator(&local_e69);
  local_e98.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__37,void>
            ((function<void(char_const*)> *)&local_e90,&local_e98);
  addChoices(this,initHandlers::yn_choices,true,&local_e90);
  std::function<void_(const_char_*)>::~function(&local_e90);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_eb8,"modifyOther",&local_eb9);
  pushKey(this,&local_eb8);
  std::__cxx11::string::~string((string *)&local_eb8);
  std::allocator<char>::~allocator(&local_eb9);
  local_ee8.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__38,void>
            ((function<void(char_const*)> *)&local_ee0,&local_ee8);
  addChoices(this,initHandlers::yn_choices,true,&local_ee0);
  std::function<void_(const_char_*)>::~function(&local_ee0);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f08,"modify",&local_f09);
  pushKey(this,&local_f08);
  std::__cxx11::string::~string((string *)&local_f08);
  std::allocator<char>::~allocator(&local_f09);
  local_f38.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__39,void>
            ((function<void(char_const*)> *)&local_f30,&local_f38);
  addChoices(this,initHandlers::modify128_choices,true,&local_f30);
  std::function<void_(const_char_*)>::~function(&local_f30);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f58,"print",&local_f59);
  pushKey(this,&local_f58);
  std::__cxx11::string::~string((string *)&local_f58);
  std::allocator<char>::~allocator(&local_f59);
  local_f88.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__40,void>
            ((function<void(char_const*)> *)&local_f80,&local_f88);
  addChoices(this,initHandlers::print128_choices,true,&local_f80);
  std::function<void_(const_char_*)>::~function(&local_f80);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_fa8,"forceV4",&local_fa9);
  pushKey(this,&local_fa8);
  std::__cxx11::string::~string((string *)&local_fa8);
  std::allocator<char>::~allocator(&local_fa9);
  local_fd8.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__41,void>
            ((function<void()> *)&local_fd0,&local_fd8);
  addBare(this,&local_fd0);
  std::function<void_()>::~function(&local_fd0);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ff8,"useAes",&local_ff9);
  pushKey(this,&local_ff8);
  std::__cxx11::string::~string((string *)&local_ff8);
  std::allocator<char>::~allocator(&local_ff9);
  local_1028.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__42,void>
            ((function<void(char_const*)> *)&local_1020,&local_1028);
  addChoices(this,initHandlers::yn_choices,true,&local_1020);
  std::function<void_(const_char_*)>::~function(&local_1020);
  popHandler(this);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1048,"256bit",&local_1049);
  pushKey(this,&local_1048);
  std::__cxx11::string::~string((string *)&local_1048);
  std::allocator<char>::~allocator(&local_1049);
  local_1080 = beginEncrypt256bit;
  local_1078 = 0;
  bindJSON(&local_1070,this,0x285890);
  local_10b0 = endEncrypt256bit;
  local_10a8 = 0;
  bindBare(&local_10a0,this,0x2858a0);
  beginDict(this,&local_1070,&local_10a0);
  std::function<void_()>::~function(&local_10a0);
  std::function<void_(JSON)>::~function(&local_1070);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_10d0,"accessibility",&local_10d1);
  pushKey(this,&local_10d0);
  std::__cxx11::string::~string((string *)&local_10d0);
  std::allocator<char>::~allocator(&local_10d1);
  local_1100.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__43,void>
            ((function<void(char_const*)> *)&local_10f8,&local_1100);
  addChoices(this,initHandlers::yn_choices,true,&local_10f8);
  std::function<void_(const_char_*)>::~function(&local_10f8);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1120,"annotate",&local_1121);
  pushKey(this,&local_1120);
  std::__cxx11::string::~string((string *)&local_1120);
  std::allocator<char>::~allocator(&local_1121);
  local_1150.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__44,void>
            ((function<void(char_const*)> *)&local_1148,&local_1150);
  addChoices(this,initHandlers::yn_choices,true,&local_1148);
  std::function<void_(const_char_*)>::~function(&local_1148);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1170,"assemble",&local_1171);
  pushKey(this,&local_1170);
  std::__cxx11::string::~string((string *)&local_1170);
  std::allocator<char>::~allocator(&local_1171);
  local_11a0.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__45,void>
            ((function<void(char_const*)> *)&local_1198,&local_11a0);
  addChoices(this,initHandlers::yn_choices,true,&local_1198);
  std::function<void_(const_char_*)>::~function(&local_1198);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_11c0,"cleartextMetadata",&local_11c1);
  pushKey(this,&local_11c0);
  std::__cxx11::string::~string((string *)&local_11c0);
  std::allocator<char>::~allocator(&local_11c1);
  local_11f0.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__46,void>
            ((function<void()> *)&local_11e8,&local_11f0);
  addBare(this,&local_11e8);
  std::function<void_()>::~function(&local_11e8);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1210,"extract",&local_1211);
  pushKey(this,&local_1210);
  std::__cxx11::string::~string((string *)&local_1210);
  std::allocator<char>::~allocator(&local_1211);
  local_1240.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__47,void>
            ((function<void(char_const*)> *)&local_1238,&local_1240);
  addChoices(this,initHandlers::yn_choices,true,&local_1238);
  std::function<void_(const_char_*)>::~function(&local_1238);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1260,"form",&local_1261);
  pushKey(this,&local_1260);
  std::__cxx11::string::~string((string *)&local_1260);
  std::allocator<char>::~allocator(&local_1261);
  local_1290.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__48,void>
            ((function<void(char_const*)> *)&local_1288,&local_1290);
  addChoices(this,initHandlers::yn_choices,true,&local_1288);
  std::function<void_(const_char_*)>::~function(&local_1288);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12b0,"modifyOther",&local_12b1);
  pushKey(this,&local_12b0);
  std::__cxx11::string::~string((string *)&local_12b0);
  std::allocator<char>::~allocator(&local_12b1);
  local_12e0.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__49,void>
            ((function<void(char_const*)> *)&local_12d8,&local_12e0);
  addChoices(this,initHandlers::yn_choices,true,&local_12d8);
  std::function<void_(const_char_*)>::~function(&local_12d8);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1300,"modify",&local_1301);
  pushKey(this,&local_1300);
  std::__cxx11::string::~string((string *)&local_1300);
  std::allocator<char>::~allocator(&local_1301);
  local_1330.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__50,void>
            ((function<void(char_const*)> *)&local_1328,&local_1330);
  addChoices(this,initHandlers::modify128_choices,true,&local_1328);
  std::function<void_(const_char_*)>::~function(&local_1328);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1350,"print",&local_1351);
  pushKey(this,&local_1350);
  std::__cxx11::string::~string((string *)&local_1350);
  std::allocator<char>::~allocator(&local_1351);
  local_1380.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__51,void>
            ((function<void(char_const*)> *)&local_1378,&local_1380);
  addChoices(this,initHandlers::print128_choices,true,&local_1378);
  std::function<void_(const_char_*)>::~function(&local_1378);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_13a0,"allowInsecure",&local_13a1);
  pushKey(this,&local_13a0);
  std::__cxx11::string::~string((string *)&local_13a0);
  std::allocator<char>::~allocator(&local_13a1);
  local_13d0.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__52,void>
            ((function<void()> *)&local_13c8,&local_13d0);
  addBare(this,&local_13c8);
  std::function<void_()>::~function(&local_13c8);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_13f0,"forceR5",&local_13f1);
  pushKey(this,&local_13f0);
  std::__cxx11::string::~string((string *)&local_13f0);
  std::allocator<char>::~allocator(&local_13f1);
  local_1420.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__53,void>
            ((function<void()> *)&local_1418,&local_1420);
  addBare(this,&local_1418);
  std::function<void_()>::~function(&local_1418);
  popHandler(this);
  popHandler(this);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1440,"check",&local_1441);
  pushKey(this,&local_1440);
  std::__cxx11::string::~string((string *)&local_1440);
  std::allocator<char>::~allocator(&local_1441);
  local_1470.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__54,void>
            ((function<void()> *)&local_1468,&local_1470);
  addBare(this,&local_1468);
  std::function<void_()>::~function(&local_1468);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1490,"checkLinearization",&local_1491);
  pushKey(this,&local_1490);
  std::__cxx11::string::~string((string *)&local_1490);
  std::allocator<char>::~allocator(&local_1491);
  local_14c0.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__55,void>
            ((function<void()> *)&local_14b8,&local_14c0);
  addBare(this,&local_14b8);
  std::function<void_()>::~function(&local_14b8);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14e0,"filteredStreamData",&local_14e1);
  pushKey(this,&local_14e0);
  std::__cxx11::string::~string((string *)&local_14e0);
  std::allocator<char>::~allocator(&local_14e1);
  local_1510.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__56,void>
            ((function<void()> *)&local_1508,&local_1510);
  addBare(this,&local_1508);
  std::function<void_()>::~function(&local_1508);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1530,"rawStreamData",&local_1531);
  pushKey(this,&local_1530);
  std::__cxx11::string::~string((string *)&local_1530);
  std::allocator<char>::~allocator(&local_1531);
  local_1560.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__57,void>
            ((function<void()> *)&local_1558,&local_1560);
  addBare(this,&local_1558);
  std::function<void_()>::~function(&local_1558);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1580,"showEncryption",&local_1581);
  pushKey(this,&local_1580);
  std::__cxx11::string::~string((string *)&local_1580);
  std::allocator<char>::~allocator(&local_1581);
  local_15b0.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__58,void>
            ((function<void()> *)&local_15a8,&local_15b0);
  addBare(this,&local_15a8);
  std::function<void_()>::~function(&local_15a8);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_15d0,"showEncryptionKey",&local_15d1);
  pushKey(this,&local_15d0);
  std::__cxx11::string::~string((string *)&local_15d0);
  std::allocator<char>::~allocator(&local_15d1);
  local_1600.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__59,void>
            ((function<void()> *)&local_15f8,&local_1600);
  addBare(this,&local_15f8);
  std::function<void_()>::~function(&local_15f8);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1620,"showLinearization",&local_1621);
  pushKey(this,&local_1620);
  std::__cxx11::string::~string((string *)&local_1620);
  std::allocator<char>::~allocator(&local_1621);
  local_1650.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__60,void>
            ((function<void()> *)&local_1648,&local_1650);
  addBare(this,&local_1648);
  std::function<void_()>::~function(&local_1648);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1670,"showNpages",&local_1671)
  ;
  pushKey(this,&local_1670);
  std::__cxx11::string::~string((string *)&local_1670);
  std::allocator<char>::~allocator(&local_1671);
  local_16a0.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__61,void>
            ((function<void()> *)&local_1698,&local_16a0);
  addBare(this,&local_1698);
  std::function<void_()>::~function(&local_1698);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_16c0,"showObject",&local_16c1)
  ;
  pushKey(this,&local_16c0);
  std::__cxx11::string::~string((string *)&local_16c0);
  std::allocator<char>::~allocator(&local_16c1);
  local_16f0.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__62,void>
            ((function<void(char_const*)> *)&local_16e8,&local_16f0);
  addParameter(this,&local_16e8);
  std::function<void_(const_char_*)>::~function(&local_16e8);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1710,"showPages",&local_1711);
  pushKey(this,&local_1710);
  std::__cxx11::string::~string((string *)&local_1710);
  std::allocator<char>::~allocator(&local_1711);
  local_1740.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__63,void>
            ((function<void()> *)&local_1738,&local_1740);
  addBare(this,&local_1738);
  std::function<void_()>::~function(&local_1738);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1760,"showXref",&local_1761);
  pushKey(this,&local_1760);
  std::__cxx11::string::~string((string *)&local_1760);
  std::allocator<char>::~allocator(&local_1761);
  local_1790.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__64,void>
            ((function<void()> *)&local_1788,&local_1790);
  addBare(this,&local_1788);
  std::function<void_()>::~function(&local_1788);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_17b0,"withImages",&local_17b1)
  ;
  pushKey(this,&local_17b0);
  std::__cxx11::string::~string((string *)&local_17b0);
  std::allocator<char>::~allocator(&local_17b1);
  local_17e0.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__65,void>
            ((function<void()> *)&local_17d8,&local_17e0);
  addBare(this,&local_17d8);
  std::function<void_()>::~function(&local_17d8);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1800,"listAttachments",&local_1801);
  pushKey(this,&local_1800);
  std::__cxx11::string::~string((string *)&local_1800);
  std::allocator<char>::~allocator(&local_1801);
  local_1830.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__66,void>
            ((function<void()> *)&local_1828,&local_1830);
  addBare(this,&local_1828);
  std::function<void_()>::~function(&local_1828);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1850,"showAttachment",&local_1851);
  pushKey(this,&local_1850);
  std::__cxx11::string::~string((string *)&local_1850);
  std::allocator<char>::~allocator(&local_1851);
  local_1880.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__67,void>
            ((function<void(char_const*)> *)&local_1878,&local_1880);
  addParameter(this,&local_1878);
  std::function<void_(const_char_*)>::~function(&local_1878);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_18a0,"json",&local_18a1);
  pushKey(this,&local_18a0);
  std::__cxx11::string::~string((string *)&local_18a0);
  std::allocator<char>::~allocator(&local_18a1);
  local_18d0.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__68,void>
            ((function<void(char_const*)> *)&local_18c8,&local_18d0);
  addChoices(this,initHandlers::json_version_choices,false,&local_18c8);
  std::function<void_(const_char_*)>::~function(&local_18c8);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_18f0,"jsonKey",&local_18f1);
  pushKey(this,&local_18f0);
  std::__cxx11::string::~string((string *)&local_18f0);
  std::allocator<char>::~allocator(&local_18f1);
  local_1928 = beginJsonKeyArray;
  local_1920 = 0;
  bindJSON(&local_1918,this,0x286990);
  local_1958 = endJsonKeyArray;
  local_1950 = 0;
  bindBare(&local_1948,this,0x2869a0);
  beginArray(this,&local_1918,&local_1948);
  std::function<void_()>::~function(&local_1948);
  std::function<void_(JSON)>::~function(&local_1918);
  local_1980.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__69,void>
            ((function<void(char_const*)> *)&local_1978,&local_1980);
  addChoices(this,initHandlers::json_key_choices,true,&local_1978);
  std::function<void_(const_char_*)>::~function(&local_1978);
  popHandler(this);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_19a0,"jsonObject",&local_19a1)
  ;
  pushKey(this,&local_19a0);
  std::__cxx11::string::~string((string *)&local_19a0);
  std::allocator<char>::~allocator(&local_19a1);
  local_19d8 = beginJsonObjectArray;
  local_19d0 = 0;
  bindJSON(&local_19c8,this,0x286a40);
  local_1a08 = endJsonObjectArray;
  local_1a00 = 0;
  bindBare(&local_19f8,this,0x286a50);
  beginArray(this,&local_19c8,&local_19f8);
  std::function<void_()>::~function(&local_19f8);
  std::function<void_(JSON)>::~function(&local_19c8);
  local_1a30.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__70,void>
            ((function<void(char_const*)> *)&local_1a28,&local_1a30);
  addParameter(this,&local_1a28);
  std::function<void_(const_char_*)>::~function(&local_1a28);
  popHandler(this);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a50,"jsonStreamData",&local_1a51);
  pushKey(this,&local_1a50);
  std::__cxx11::string::~string((string *)&local_1a50);
  std::allocator<char>::~allocator(&local_1a51);
  local_1a80.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__71,void>
            ((function<void(char_const*)> *)&local_1a78,&local_1a80);
  addChoices(this,initHandlers::json_stream_data_choices,true,&local_1a78);
  std::function<void_(const_char_*)>::~function(&local_1a78);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1aa0,"jsonStreamPrefix",&local_1aa1);
  pushKey(this,&local_1aa0);
  std::__cxx11::string::~string((string *)&local_1aa0);
  std::allocator<char>::~allocator(&local_1aa1);
  local_1ad0.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__72,void>
            ((function<void(char_const*)> *)&local_1ac8,&local_1ad0);
  addParameter(this,&local_1ac8);
  std::function<void_(const_char_*)>::~function(&local_1ac8);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1af0,"updateFromJson",&local_1af1);
  pushKey(this,&local_1af0);
  std::__cxx11::string::~string((string *)&local_1af0);
  std::allocator<char>::~allocator(&local_1af1);
  local_1b20.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__73,void>
            ((function<void(char_const*)> *)&local_1b18,&local_1b20);
  addParameter(this,&local_1b18);
  std::function<void_(const_char_*)>::~function(&local_1b18);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b40,"allowWeakCrypto",&local_1b41);
  pushKey(this,&local_1b40);
  std::__cxx11::string::~string((string *)&local_1b40);
  std::allocator<char>::~allocator(&local_1b41);
  local_1b70.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__74,void>
            ((function<void()> *)&local_1b68,&local_1b70);
  addBare(this,&local_1b68);
  std::function<void_()>::~function(&local_1b68);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b90,"keepFilesOpen",&local_1b91);
  pushKey(this,&local_1b90);
  std::__cxx11::string::~string((string *)&local_1b90);
  std::allocator<char>::~allocator(&local_1b91);
  local_1bc0.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__75,void>
            ((function<void(char_const*)> *)&local_1bb8,&local_1bc0);
  addChoices(this,initHandlers::yn_choices,true,&local_1bb8);
  std::function<void_(const_char_*)>::~function(&local_1bb8);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1be0,"keepFilesOpenThreshold",&local_1be1);
  pushKey(this,&local_1be0);
  std::__cxx11::string::~string((string *)&local_1be0);
  std::allocator<char>::~allocator(&local_1be1);
  local_1c10.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__76,void>
            ((function<void(char_const*)> *)&local_1c08,&local_1c10);
  addParameter(this,&local_1c08);
  std::function<void_(const_char_*)>::~function(&local_1c08);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c30,"noWarn",&local_1c31);
  pushKey(this,&local_1c30);
  std::__cxx11::string::~string((string *)&local_1c30);
  std::allocator<char>::~allocator(&local_1c31);
  local_1c60.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__77,void>
            ((function<void()> *)&local_1c58,&local_1c60);
  addBare(this,&local_1c58);
  std::function<void_()>::~function(&local_1c58);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c80,"verbose",&local_1c81);
  pushKey(this,&local_1c80);
  std::__cxx11::string::~string((string *)&local_1c80);
  std::allocator<char>::~allocator(&local_1c81);
  local_1cb0.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__78,void>
            ((function<void()> *)&local_1ca8,&local_1cb0);
  addBare(this,&local_1ca8);
  std::function<void_()>::~function(&local_1ca8);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1cd0,"testJsonSchema",&local_1cd1);
  pushKey(this,&local_1cd0);
  std::__cxx11::string::~string((string *)&local_1cd0);
  std::allocator<char>::~allocator(&local_1cd1);
  local_1d00.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__79,void>
            ((function<void()> *)&local_1cf8,&local_1d00);
  addBare(this,&local_1cf8);
  std::function<void_()>::~function(&local_1cf8);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d20,"ignoreXrefStreams",&local_1d21);
  pushKey(this,&local_1d20);
  std::__cxx11::string::~string((string *)&local_1d20);
  std::allocator<char>::~allocator(&local_1d21);
  local_1d50.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__80,void>
            ((function<void()> *)&local_1d48,&local_1d50);
  addBare(this,&local_1d48);
  std::function<void_()>::~function(&local_1d48);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d70,"passwordIsHexKey",&local_1d71);
  pushKey(this,&local_1d70);
  std::__cxx11::string::~string((string *)&local_1d70);
  std::allocator<char>::~allocator(&local_1d71);
  local_1da0.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__81,void>
            ((function<void()> *)&local_1d98,&local_1da0);
  addBare(this,&local_1d98);
  std::function<void_()>::~function(&local_1d98);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1dc0,"passwordMode",&local_1dc1);
  pushKey(this,&local_1dc0);
  std::__cxx11::string::~string((string *)&local_1dc0);
  std::allocator<char>::~allocator(&local_1dc1);
  local_1df0.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__82,void>
            ((function<void(char_const*)> *)&local_1de8,&local_1df0);
  addChoices(this,initHandlers::password_mode_choices,true,&local_1de8);
  std::function<void_(const_char_*)>::~function(&local_1de8);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e10,"suppressPasswordRecovery",&local_1e11);
  pushKey(this,&local_1e10);
  std::__cxx11::string::~string((string *)&local_1e10);
  std::allocator<char>::~allocator(&local_1e11);
  local_1e40.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__83,void>
            ((function<void()> *)&local_1e38,&local_1e40);
  addBare(this,&local_1e38);
  std::function<void_()>::~function(&local_1e38);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e60,"suppressRecovery",&local_1e61);
  pushKey(this,&local_1e60);
  std::__cxx11::string::~string((string *)&local_1e60);
  std::allocator<char>::~allocator(&local_1e61);
  local_1e90.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__84,void>
            ((function<void()> *)&local_1e88,&local_1e90);
  addBare(this,&local_1e88);
  std::function<void_()>::~function(&local_1e88);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1eb0,"coalesceContents",&local_1eb1);
  pushKey(this,&local_1eb0);
  std::__cxx11::string::~string((string *)&local_1eb0);
  std::allocator<char>::~allocator(&local_1eb1);
  local_1ee0.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__85,void>
            ((function<void()> *)&local_1ed8,&local_1ee0);
  addBare(this,&local_1ed8);
  std::function<void_()>::~function(&local_1ed8);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f00,"compressionLevel",&local_1f01);
  pushKey(this,&local_1f00);
  std::__cxx11::string::~string((string *)&local_1f00);
  std::allocator<char>::~allocator(&local_1f01);
  local_1f30.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__86,void>
            ((function<void(char_const*)> *)&local_1f28,&local_1f30);
  addParameter(this,&local_1f28);
  std::function<void_(const_char_*)>::~function(&local_1f28);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f50,"jpegQuality",&local_1f51);
  pushKey(this,&local_1f50);
  std::__cxx11::string::~string((string *)&local_1f50);
  std::allocator<char>::~allocator(&local_1f51);
  local_1f80.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__87,void>
            ((function<void(char_const*)> *)&local_1f78,&local_1f80);
  addParameter(this,&local_1f78);
  std::function<void_(const_char_*)>::~function(&local_1f78);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1fa0,"externalizeInlineImages",&local_1fa1);
  pushKey(this,&local_1fa0);
  std::__cxx11::string::~string((string *)&local_1fa0);
  std::allocator<char>::~allocator(&local_1fa1);
  local_1fd0.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__88,void>
            ((function<void()> *)&local_1fc8,&local_1fd0);
  addBare(this,&local_1fc8);
  std::function<void_()>::~function(&local_1fc8);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1ff0,"iiMinBytes",&local_1ff1)
  ;
  pushKey(this,&local_1ff0);
  std::__cxx11::string::~string((string *)&local_1ff0);
  std::allocator<char>::~allocator(&local_1ff1);
  local_2020.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__89,void>
            ((function<void(char_const*)> *)&local_2018,&local_2020);
  addParameter(this,&local_2018);
  std::function<void_(const_char_*)>::~function(&local_2018);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2040,"removeUnreferencedResources",&local_2041);
  pushKey(this,&local_2040);
  std::__cxx11::string::~string((string *)&local_2040);
  std::allocator<char>::~allocator(&local_2041);
  local_2070.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__90,void>
            ((function<void(char_const*)> *)&local_2068,&local_2070);
  addChoices(this,initHandlers::remove_unref_choices,true,&local_2068);
  std::function<void_(const_char_*)>::~function(&local_2068);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2090,"addAttachment",&local_2091);
  pushKey(this,&local_2090);
  std::__cxx11::string::~string((string *)&local_2090);
  std::allocator<char>::~allocator(&local_2091);
  local_20c8 = beginAddAttachmentArray;
  local_20c0 = 0;
  bindJSON(&local_20b8,this,0x287630);
  local_20f8 = endAddAttachmentArray;
  local_20f0 = 0;
  bindBare(&local_20e8,this,0x287640);
  beginArray(this,&local_20b8,&local_20e8);
  std::function<void_()>::~function(&local_20e8);
  std::function<void_(JSON)>::~function(&local_20b8);
  local_2128 = beginAddAttachment;
  local_2120 = 0;
  bindJSON(&local_2118,this,0x287650);
  local_2158 = endAddAttachment;
  local_2150 = 0;
  bindBare(&local_2148,this,0x2876a0);
  beginDict(this,&local_2118,&local_2148);
  std::function<void_()>::~function(&local_2148);
  std::function<void_(JSON)>::~function(&local_2118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2178,"file",&local_2179);
  pushKey(this,&local_2178);
  std::__cxx11::string::~string((string *)&local_2178);
  std::allocator<char>::~allocator(&local_2179);
  setupAddAttachmentFile(this);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_21a0,"creationdate",&local_21a1);
  pushKey(this,&local_21a0);
  std::__cxx11::string::~string((string *)&local_21a0);
  std::allocator<char>::~allocator(&local_21a1);
  local_21d0.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__91,void>
            ((function<void(char_const*)> *)&local_21c8,&local_21d0);
  addParameter(this,&local_21c8);
  std::function<void_(const_char_*)>::~function(&local_21c8);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_21f0,"description",&local_21f1);
  pushKey(this,&local_21f0);
  std::__cxx11::string::~string((string *)&local_21f0);
  std::allocator<char>::~allocator(&local_21f1);
  local_2220.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__92,void>
            ((function<void(char_const*)> *)&local_2218,&local_2220);
  addParameter(this,&local_2218);
  std::function<void_(const_char_*)>::~function(&local_2218);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2240,"filename",&local_2241);
  pushKey(this,&local_2240);
  std::__cxx11::string::~string((string *)&local_2240);
  std::allocator<char>::~allocator(&local_2241);
  local_2270.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__93,void>
            ((function<void(char_const*)> *)&local_2268,&local_2270);
  addParameter(this,&local_2268);
  std::function<void_(const_char_*)>::~function(&local_2268);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2290,"key",&local_2291);
  pushKey(this,&local_2290);
  std::__cxx11::string::~string((string *)&local_2290);
  std::allocator<char>::~allocator(&local_2291);
  local_22c0.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__94,void>
            ((function<void(char_const*)> *)&local_22b8,&local_22c0);
  addParameter(this,&local_22b8);
  std::function<void_(const_char_*)>::~function(&local_22b8);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_22e0,"mimetype",&local_22e1);
  pushKey(this,&local_22e0);
  std::__cxx11::string::~string((string *)&local_22e0);
  std::allocator<char>::~allocator(&local_22e1);
  local_2310.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__95,void>
            ((function<void(char_const*)> *)&local_2308,&local_2310);
  addParameter(this,&local_2308);
  std::function<void_(const_char_*)>::~function(&local_2308);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2330,"moddate",&local_2331);
  pushKey(this,&local_2330);
  std::__cxx11::string::~string((string *)&local_2330);
  std::allocator<char>::~allocator(&local_2331);
  local_2360.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__96,void>
            ((function<void(char_const*)> *)&local_2358,&local_2360);
  addParameter(this,&local_2358);
  std::function<void_(const_char_*)>::~function(&local_2358);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2380,"replace",&local_2381);
  pushKey(this,&local_2380);
  std::__cxx11::string::~string((string *)&local_2380);
  std::allocator<char>::~allocator(&local_2381);
  local_23b0.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__97,void>
            ((function<void()> *)&local_23a8,&local_23b0);
  addBare(this,&local_23a8);
  std::function<void_()>::~function(&local_23a8);
  popHandler(this);
  popHandler(this);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_23d0,"removeAttachment",&local_23d1);
  pushKey(this,&local_23d0);
  std::__cxx11::string::~string((string *)&local_23d0);
  std::allocator<char>::~allocator(&local_23d1);
  local_2408 = beginRemoveAttachmentArray;
  local_2400 = 0;
  bindJSON(&local_23f8,this,0x287b60);
  local_2438 = endRemoveAttachmentArray;
  local_2430 = 0;
  bindBare(&local_2428,this,0x287b70);
  beginArray(this,&local_23f8,&local_2428);
  std::function<void_()>::~function(&local_2428);
  std::function<void_(JSON)>::~function(&local_23f8);
  local_2460.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__98,void>
            ((function<void(char_const*)> *)&local_2458,&local_2460);
  addParameter(this,&local_2458);
  std::function<void_(const_char_*)>::~function(&local_2458);
  popHandler(this);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2480,"copyAttachmentsFrom",&local_2481);
  pushKey(this,&local_2480);
  std::__cxx11::string::~string((string *)&local_2480);
  std::allocator<char>::~allocator(&local_2481);
  local_24b8 = beginCopyAttachmentsFromArray;
  local_24b0 = 0;
  bindJSON(&local_24a8,this,0x287c10);
  local_24e8 = endCopyAttachmentsFromArray;
  local_24e0 = 0;
  bindBare(&local_24d8,this,0x287c20);
  beginArray(this,&local_24a8,&local_24d8);
  std::function<void_()>::~function(&local_24d8);
  std::function<void_(JSON)>::~function(&local_24a8);
  local_2518 = beginCopyAttachmentsFrom;
  local_2510 = 0;
  bindJSON(&local_2508,this,0x287c30);
  local_2548 = endCopyAttachmentsFrom;
  local_2540 = 0;
  bindBare(&local_2538,this,0x287c80);
  beginDict(this,&local_2508,&local_2538);
  std::function<void_()>::~function(&local_2538);
  std::function<void_(JSON)>::~function(&local_2508);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2568,"file",&local_2569);
  pushKey(this,&local_2568);
  std::__cxx11::string::~string((string *)&local_2568);
  std::allocator<char>::~allocator(&local_2569);
  setupCopyAttachmentsFromFile(this);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2590,"password",&local_2591);
  pushKey(this,&local_2590);
  std::__cxx11::string::~string((string *)&local_2590);
  std::allocator<char>::~allocator(&local_2591);
  setupCopyAttachmentsFromPassword(this);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_25b8,"prefix",&local_25b9);
  pushKey(this,&local_25b8);
  std::__cxx11::string::~string((string *)&local_25b8);
  std::allocator<char>::~allocator(&local_25b9);
  local_25e8.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__99,void>
            ((function<void(char_const*)> *)&local_25e0,&local_25e8);
  addParameter(this,&local_25e0);
  std::function<void_(const_char_*)>::~function(&local_25e0);
  popHandler(this);
  popHandler(this);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2608,"collate",&local_2609);
  pushKey(this,&local_2608);
  std::__cxx11::string::~string((string *)&local_2608);
  std::allocator<char>::~allocator(&local_2609);
  local_2638.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__100,void>
            ((function<void(char_const*)> *)&local_2630,&local_2638);
  addParameter(this,&local_2630);
  std::function<void_(const_char_*)>::~function(&local_2630);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2658,"flattenAnnotations",&local_2659);
  pushKey(this,&local_2658);
  std::__cxx11::string::~string((string *)&local_2658);
  std::allocator<char>::~allocator(&local_2659);
  local_2688.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__101,void>
            ((function<void(char_const*)> *)&local_2680,&local_2688);
  addChoices(this,initHandlers::flatten_choices,true,&local_2680);
  std::function<void_(const_char_*)>::~function(&local_2680);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_26a8,"flattenRotation",&local_26a9);
  pushKey(this,&local_26a8);
  std::__cxx11::string::~string((string *)&local_26a8);
  std::allocator<char>::~allocator(&local_26a9);
  local_26d8.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__102,void>
            ((function<void()> *)&local_26d0,&local_26d8);
  addBare(this,&local_26d0);
  std::function<void_()>::~function(&local_26d0);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_26f8,"generateAppearances",&local_26f9);
  pushKey(this,&local_26f8);
  std::__cxx11::string::~string((string *)&local_26f8);
  std::allocator<char>::~allocator(&local_26f9);
  local_2728.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__103,void>
            ((function<void()> *)&local_2720,&local_2728);
  addBare(this,&local_2720);
  std::function<void_()>::~function(&local_2720);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2748,"keepInlineImages",&local_2749);
  pushKey(this,&local_2748);
  std::__cxx11::string::~string((string *)&local_2748);
  std::allocator<char>::~allocator(&local_2749);
  local_2778.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__104,void>
            ((function<void()> *)&local_2770,&local_2778);
  addBare(this,&local_2770);
  std::function<void_()>::~function(&local_2770);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2798,"oiMinArea",&local_2799);
  pushKey(this,&local_2798);
  std::__cxx11::string::~string((string *)&local_2798);
  std::allocator<char>::~allocator(&local_2799);
  local_27c8.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__105,void>
            ((function<void(char_const*)> *)&local_27c0,&local_27c8);
  addParameter(this,&local_27c0);
  std::function<void_(const_char_*)>::~function(&local_27c0);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_27e8,"oiMinHeight",&local_27e9);
  pushKey(this,&local_27e8);
  std::__cxx11::string::~string((string *)&local_27e8);
  std::allocator<char>::~allocator(&local_27e9);
  local_2818.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__106,void>
            ((function<void(char_const*)> *)&local_2810,&local_2818);
  addParameter(this,&local_2810);
  std::function<void_(const_char_*)>::~function(&local_2810);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2838,"oiMinWidth",&local_2839)
  ;
  pushKey(this,&local_2838);
  std::__cxx11::string::~string((string *)&local_2838);
  std::allocator<char>::~allocator(&local_2839);
  local_2868.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__107,void>
            ((function<void(char_const*)> *)&local_2860,&local_2868);
  addParameter(this,&local_2860);
  std::function<void_(const_char_*)>::~function(&local_2860);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2888,"optimizeImages",&local_2889);
  pushKey(this,&local_2888);
  std::__cxx11::string::~string((string *)&local_2888);
  std::allocator<char>::~allocator(&local_2889);
  local_28b8.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__108,void>
            ((function<void()> *)&local_28b0,&local_28b8);
  addBare(this,&local_28b0);
  std::function<void_()>::~function(&local_28b0);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28d8,"pages",&local_28d9);
  pushKey(this,&local_28d8);
  std::__cxx11::string::~string((string *)&local_28d8);
  std::allocator<char>::~allocator(&local_28d9);
  local_2910 = beginPagesArray;
  local_2908 = 0;
  bindJSON(&local_2900,this,0x288360);
  local_2940 = endPagesArray;
  local_2938 = 0;
  bindBare(&local_2930,this,0x2883b0);
  beginArray(this,&local_2900,&local_2930);
  std::function<void_()>::~function(&local_2930);
  std::function<void_(JSON)>::~function(&local_2900);
  local_2970 = beginPages;
  local_2968 = 0;
  bindJSON(&local_2960,this,0x288410);
  local_29a0 = endPages;
  local_2998 = 0;
  bindBare(&local_2990,this,0x288610);
  beginDict(this,&local_2960,&local_2990);
  std::function<void_()>::~function(&local_2990);
  std::function<void_(JSON)>::~function(&local_2960);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_29c0,"file",&local_29c1);
  pushKey(this,&local_29c0);
  std::__cxx11::string::~string((string *)&local_29c0);
  std::allocator<char>::~allocator(&local_29c1);
  setupPagesFile(this);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_29e8,"password",&local_29e9);
  pushKey(this,&local_29e8);
  std::__cxx11::string::~string((string *)&local_29e8);
  std::allocator<char>::~allocator(&local_29e9);
  setupPagesPassword(this);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a10,"range",&local_2a11);
  pushKey(this,&local_2a10);
  std::__cxx11::string::~string((string *)&local_2a10);
  std::allocator<char>::~allocator(&local_2a11);
  local_2a40.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__109,void>
            ((function<void(char_const*)> *)&local_2a38,&local_2a40);
  addParameter(this,&local_2a38);
  std::function<void_(const_char_*)>::~function(&local_2a38);
  popHandler(this);
  popHandler(this);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a60,"removeInfo",&local_2a61)
  ;
  pushKey(this,&local_2a60);
  std::__cxx11::string::~string((string *)&local_2a60);
  std::allocator<char>::~allocator(&local_2a61);
  local_2a90.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__110,void>
            ((function<void()> *)&local_2a88,&local_2a90);
  addBare(this,&local_2a88);
  std::function<void_()>::~function(&local_2a88);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2ab0,"removeMetadata",&local_2ab1);
  pushKey(this,&local_2ab0);
  std::__cxx11::string::~string((string *)&local_2ab0);
  std::allocator<char>::~allocator(&local_2ab1);
  local_2ae0.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__111,void>
            ((function<void()> *)&local_2ad8,&local_2ae0);
  addBare(this,&local_2ad8);
  std::function<void_()>::~function(&local_2ad8);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b00,"removePageLabels",&local_2b01);
  pushKey(this,&local_2b00);
  std::__cxx11::string::~string((string *)&local_2b00);
  std::allocator<char>::~allocator(&local_2b01);
  local_2b30.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__112,void>
            ((function<void()> *)&local_2b28,&local_2b30);
  addBare(this,&local_2b28);
  std::function<void_()>::~function(&local_2b28);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b50,"removeStructure",&local_2b51);
  pushKey(this,&local_2b50);
  std::__cxx11::string::~string((string *)&local_2b50);
  std::allocator<char>::~allocator(&local_2b51);
  local_2b80.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__113,void>
            ((function<void()> *)&local_2b78,&local_2b80);
  addBare(this,&local_2b78);
  std::function<void_()>::~function(&local_2b78);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2ba0,"reportMemoryUsage",&local_2ba1);
  pushKey(this,&local_2ba0);
  std::__cxx11::string::~string((string *)&local_2ba0);
  std::allocator<char>::~allocator(&local_2ba1);
  local_2bd0.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__114,void>
            ((function<void()> *)&local_2bc8,&local_2bd0);
  addBare(this,&local_2bc8);
  std::function<void_()>::~function(&local_2bc8);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2bf0,"rotate",&local_2bf1);
  pushKey(this,&local_2bf0);
  std::__cxx11::string::~string((string *)&local_2bf0);
  std::allocator<char>::~allocator(&local_2bf1);
  local_2c28 = beginRotateArray;
  local_2c20 = 0;
  bindJSON(&local_2c18,this,0x288a10);
  local_2c58 = endRotateArray;
  local_2c50 = 0;
  bindBare(&local_2c48,this,0x288a20);
  beginArray(this,&local_2c18,&local_2c48);
  std::function<void_()>::~function(&local_2c48);
  std::function<void_(JSON)>::~function(&local_2c18);
  local_2c80.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__115,void>
            ((function<void(char_const*)> *)&local_2c78,&local_2c80);
  addParameter(this,&local_2c78);
  std::function<void_(const_char_*)>::~function(&local_2c78);
  popHandler(this);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2ca0,"setPageLabels",&local_2ca1);
  pushKey(this,&local_2ca0);
  std::__cxx11::string::~string((string *)&local_2ca0);
  std::allocator<char>::~allocator(&local_2ca1);
  local_2cd8 = beginSetPageLabelsArray;
  local_2cd0 = 0;
  bindJSON(&local_2cc8,this,0x288ac0);
  local_2d08 = endSetPageLabelsArray;
  local_2d00 = 0;
  bindBare(&local_2cf8,this,0x288ad0);
  beginArray(this,&local_2cc8,&local_2cf8);
  std::function<void_()>::~function(&local_2cf8);
  std::function<void_(JSON)>::~function(&local_2cc8);
  setupSetPageLabels(this);
  popHandler(this);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d28,"overlay",&local_2d29);
  pushKey(this,&local_2d28);
  std::__cxx11::string::~string((string *)&local_2d28);
  std::allocator<char>::~allocator(&local_2d29);
  local_2d60 = beginOverlayArray;
  local_2d58 = 0;
  bindJSON(&local_2d50,this,0x288ba0);
  local_2d90 = endOverlayArray;
  local_2d88 = 0;
  bindBare(&local_2d80,this,0x288bb0);
  beginArray(this,&local_2d50,&local_2d80);
  std::function<void_()>::~function(&local_2d80);
  std::function<void_(JSON)>::~function(&local_2d50);
  local_2dc0 = beginOverlay;
  local_2db8 = 0;
  bindJSON(&local_2db0,this,0x288bc0);
  local_2df0 = endOverlay;
  local_2de8 = 0;
  bindBare(&local_2de0,this,0x288c20);
  beginDict(this,&local_2db0,&local_2de0);
  std::function<void_()>::~function(&local_2de0);
  std::function<void_(JSON)>::~function(&local_2db0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e10,"file",&local_2e11);
  pushKey(this,&local_2e10);
  std::__cxx11::string::~string((string *)&local_2e10);
  std::allocator<char>::~allocator(&local_2e11);
  setupOverlayFile(this);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e38,"password",&local_2e39);
  pushKey(this,&local_2e38);
  std::__cxx11::string::~string((string *)&local_2e38);
  std::allocator<char>::~allocator(&local_2e39);
  setupOverlayPassword(this);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e60,"from",&local_2e61);
  pushKey(this,&local_2e60);
  std::__cxx11::string::~string((string *)&local_2e60);
  std::allocator<char>::~allocator(&local_2e61);
  local_2e90.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__116,void>
            ((function<void(char_const*)> *)&local_2e88,&local_2e90);
  addParameter(this,&local_2e88);
  std::function<void_(const_char_*)>::~function(&local_2e88);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2eb0,"repeat",&local_2eb1);
  pushKey(this,&local_2eb0);
  std::__cxx11::string::~string((string *)&local_2eb0);
  std::allocator<char>::~allocator(&local_2eb1);
  local_2ee0.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__117,void>
            ((function<void(char_const*)> *)&local_2ed8,&local_2ee0);
  addParameter(this,&local_2ed8);
  std::function<void_(const_char_*)>::~function(&local_2ed8);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f00,"to",&local_2f01);
  pushKey(this,&local_2f00);
  std::__cxx11::string::~string((string *)&local_2f00);
  std::allocator<char>::~allocator(&local_2f01);
  local_2f30.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__118,void>
            ((function<void(char_const*)> *)&local_2f28,&local_2f30);
  addParameter(this,&local_2f28);
  std::function<void_(const_char_*)>::~function(&local_2f28);
  popHandler(this);
  popHandler(this);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f50,"underlay",&local_2f51);
  pushKey(this,&local_2f50);
  std::__cxx11::string::~string((string *)&local_2f50);
  std::allocator<char>::~allocator(&local_2f51);
  local_2f88 = beginUnderlayArray;
  local_2f80 = 0;
  bindJSON(&local_2f78,this,0x288ec0);
  local_2fb8 = endUnderlayArray;
  local_2fb0 = 0;
  bindBare(&local_2fa8,this,0x288ed0);
  beginArray(this,&local_2f78,&local_2fa8);
  std::function<void_()>::~function(&local_2fa8);
  std::function<void_(JSON)>::~function(&local_2f78);
  local_2fe8 = beginUnderlay;
  local_2fe0 = 0;
  bindJSON(&local_2fd8,this,0x288ee0);
  local_3018 = endUnderlay;
  local_3010 = 0;
  bindBare(&local_3008,this,0x288f40);
  beginDict(this,&local_2fd8,&local_3008);
  std::function<void_()>::~function(&local_3008);
  std::function<void_(JSON)>::~function(&local_2fd8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3038,"file",&local_3039);
  pushKey(this,&local_3038);
  std::__cxx11::string::~string((string *)&local_3038);
  std::allocator<char>::~allocator(&local_3039);
  setupUnderlayFile(this);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3060,"password",&local_3061);
  pushKey(this,&local_3060);
  std::__cxx11::string::~string((string *)&local_3060);
  std::allocator<char>::~allocator(&local_3061);
  setupUnderlayPassword(this);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3088,"from",&local_3089);
  pushKey(this,&local_3088);
  std::__cxx11::string::~string((string *)&local_3088);
  std::allocator<char>::~allocator(&local_3089);
  local_30b8.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__119,void>
            ((function<void(char_const*)> *)&local_30b0,&local_30b8);
  addParameter(this,&local_30b0);
  std::function<void_(const_char_*)>::~function(&local_30b0);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30d8,"repeat",&local_30d9);
  pushKey(this,&local_30d8);
  std::__cxx11::string::~string((string *)&local_30d8);
  std::allocator<char>::~allocator(&local_30d9);
  local_3108.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__120,void>
            ((function<void(char_const*)> *)&local_3100,&local_3108);
  addParameter(this,&local_3100);
  std::function<void_(const_char_*)>::~function(&local_3100);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3128,"to",&local_3129);
  pushKey(this,&local_3128);
  std::__cxx11::string::~string((string *)&local_3128);
  std::allocator<char>::~allocator(&local_3129);
  local_3158.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__121,void>
            ((function<void(char_const*)> *)&local_3150,&local_3158);
  addParameter(this,&local_3150);
  std::function<void_(const_char_*)>::~function(&local_3150);
  popHandler(this);
  popHandler(this);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3178,"warningExit0",&local_3179);
  pushKey(this,&local_3178);
  std::__cxx11::string::~string((string *)&local_3178);
  std::allocator<char>::~allocator(&local_3179);
  local_31a8.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__122,void>
            ((function<void()> *)&local_31a0,&local_31a8);
  addBare(this,&local_31a0);
  std::function<void_()>::~function(&local_31a0);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_31c8,"jobJsonFile",&local_31c9);
  pushKey(this,&local_31c8);
  std::__cxx11::string::~string((string *)&local_31c8);
  std::allocator<char>::~allocator(&local_31c9);
  local_31f8.this = this;
  std::function<void(char_const*)>::
  function<(anonymous_namespace)::Handlers::initHandlers()::__123,void>
            ((function<void(char_const*)> *)&local_31f0,&local_31f8);
  addParameter(this,&local_31f0);
  std::function<void_(const_char_*)>::~function(&local_31f0);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3218,"preserveUnreferencedResources",&local_3219);
  pushKey(this,&local_3218);
  std::__cxx11::string::~string((string *)&local_3218);
  std::allocator<char>::~allocator(&local_3219);
  local_3248.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__124,void>
            ((function<void()> *)&local_3240,&local_3248);
  addBare(this,&local_3240);
  std::function<void_()>::~function(&local_3240);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3268,"requiresPassword",&local_3269);
  pushKey(this,&local_3268);
  std::__cxx11::string::~string((string *)&local_3268);
  std::allocator<char>::~allocator(&local_3269);
  local_3298.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__125,void>
            ((function<void()> *)&local_3290,&local_3298);
  addBare(this,&local_3290);
  std::function<void_()>::~function(&local_3290);
  popHandler(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_32b8,"isEncrypted",&local_32b9);
  pushKey(this,&local_32b8);
  std::__cxx11::string::~string((string *)&local_32b8);
  std::allocator<char>::~allocator(&local_32b9);
  local_32e8.this = this;
  std::function<void()>::function<(anonymous_namespace)::Handlers::initHandlers()::__126,void>
            ((function<void()> *)&local_32e0,&local_32e8);
  addBare(this,&local_32e0);
  std::function<void_()>::~function(&local_32e0);
  popHandler(this);
  initHandlers::anon_class_1_0_00000001::operator()(&local_32e9,initHandlers::enc_bits_choices);
  sVar2 = std::vector<std::shared_ptr<JSONHandler>,_std::allocator<std::shared_ptr<JSONHandler>_>_>
          ::size(&this->json_handlers);
  if (sVar2 != 1) {
    this_02 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_02,"QPDFJob_json: json_handlers size != 1 at end");
    __cxa_throw(this_02,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void
Handlers::initHandlers()
{
    this->json_handlers.emplace_back(std::make_shared<JSONHandler>());
    this->jh = this->json_handlers.back().get();
    jh->addDictHandlers(
        [](std::string const&, JSON) {},
        [this](std::string const&) {
            if (!this->partial) {
                c_main->checkConfiguration();
            }
        });

#include <qpdf/auto_job_json_init.hh>

    // We have `bits` in the CLI but not in the JSON. Reference this variable so it doesn't generate
    // a warning.
    [](char const**) {}(enc_bits_choices);

    if (this->json_handlers.size() != 1) {
        throw std::logic_error("QPDFJob_json: json_handlers size != 1 at end");
    }
}